

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

int gauden_eval_precomp(gauden_t *g)

{
  gauden_compute_norm(g);
  if (g->fullvar == (vector_t ****)0x0) {
    gauden_double_variance(g);
    gauden_invert_variance(g);
  }
  else {
    gauden_invert_variance_full(g);
  }
  return 0;
}

Assistant:

int
gauden_eval_precomp(gauden_t *g)
{
    gauden_compute_norm(g);	/* compute normalization factor for Gaussians */
    if (g->fullvar) {
	gauden_invert_variance_full(g);
    }
    else {
	gauden_double_variance(g);	/* pre-multiply variances by 2 for EXP dnom */
	gauden_invert_variance(g);	/* compute 1/(2 sigma^2) terms */
    }
    
    return S3_SUCCESS;
}